

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::solver_equalities_01coeff
          (solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  FILE *__stream;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  double *pdVar5;
  rc_data *prVar6;
  int *__s;
  undefined8 extraout_RAX;
  long lVar7;
  pointer pfVar8;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  string_view name;
  
  name._M_str = "solver_equalities_01coeff";
  name._M_len = 0x19;
  pvVar9 = csts;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar10 = (ulong)(this->ap).m_rows_values.m_length << 3;
  pdVar5 = (double *)operator_new__(uVar10);
  memset(pdVar5,0,uVar10);
  (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  uVar10 = (long)*(pointer *)
                  ((long)&(pmVar1->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar1->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar7 != 0x28) {
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar18 = vpbroadcastq_avx512f();
    uVar10 = 0;
    auVar19 = vpbroadcastq_avx512f();
    do {
      auVar20 = vpbroadcastq_avx512f();
      auVar21 = vmovdqa64_avx512f(auVar18);
      vpmullq_avx512dq(auVar14,auVar16);
      uVar10 = uVar10 + 8;
      auVar14 = vpaddq_avx512f(auVar14,auVar17);
      auVar18 = vporq_avx512f(auVar20,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar19,2);
      auVar18 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar1->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar9));
      bVar2 = (byte)uVar4;
      auVar20._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar18._8_8_;
      auVar20._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar20._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar18._16_8_;
      auVar20._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar18._24_8_;
      auVar20._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar18._32_8_;
      auVar20._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar18._40_8_;
      auVar20._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar18._48_8_;
      auVar20._56_8_ = (uVar4 >> 7) * auVar18._56_8_;
      auVar18 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar9->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar1->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar22._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar18._8_8_;
      auVar22._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar22._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar18._16_8_;
      auVar22._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar18._24_8_;
      auVar22._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar18._32_8_;
      auVar22._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar18._40_8_;
      auVar22._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar18._48_8_;
      auVar22._56_8_ = (uVar4 >> 7) * auVar18._56_8_;
      auVar18 = vpsubq_avx512f(auVar20,auVar22);
      auVar18 = vpsraq_avx512f(auVar18,3);
      auVar18 = vpmaxuq_avx512f(auVar21,auVar18);
    } while (((lVar7 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar10);
    auVar14 = vmovdqa64_avx512f(auVar18);
    auVar15._0_8_ = (ulong)(bVar2 & 1) * auVar14._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar21._0_8_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar3 * auVar14._8_8_ | (ulong)!bVar3 * auVar21._8_8_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar3 * auVar14._16_8_ | (ulong)!bVar3 * auVar21._16_8_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar3 * auVar14._24_8_ | (ulong)!bVar3 * auVar21._24_8_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar3 * auVar14._32_8_ | (ulong)!bVar3 * auVar21._32_8_;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar3 * auVar14._40_8_ | (ulong)!bVar3 * auVar21._40_8_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar3 * auVar14._48_8_ | (ulong)!bVar3 * auVar21._48_8_;
    auVar15._56_8_ = (uVar4 >> 7) * auVar14._56_8_ | (ulong)!SUB81(uVar4 >> 7,0) * auVar21._56_8_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmaxuq_avx512f(auVar15,ZEXT3264(auVar13));
    auVar11 = vpmaxuq_avx512vl(auVar14._0_16_,auVar14._16_16_);
    auVar12 = vpshufd_avx(auVar11,0xee);
    auVar12 = vpmaxuq_avx512vl(auVar11,auVar12);
    uVar10 = auVar12._0_8_;
  }
  uVar10 = -(ulong)(uVar10 >> 0x3c != 0) | uVar10 << 4;
  prVar6 = (rc_data *)operator_new__(uVar10);
  memset(prVar6,0,uVar10);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
  ._M_head_impl = prVar6;
  uVar10 = (long)m_ * 4;
  if (m_ < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(uVar10);
  memset(__s,0,uVar10);
  uVar10 = (long)m_ << 3;
  (this->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  if (m_ < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar10);
  memset(pdVar5,0,uVar10);
  (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      for (pfVar8 = *(pointer *)
                     &pmVar1[uVar10].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl;
          pfVar8 != *(pointer *)
                     ((long)&pmVar1[uVar10].elements.
                             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             ._M_impl + 8); pfVar8 = pfVar8 + 1) {
        if (pfVar8->factor != 1) {
          itm::solver_equalities_01coeff();
          goto LAB_0021a68b;
        }
      }
      if (pmVar1[uVar10].min != pmVar1[uVar10].max) {
LAB_0021a68b:
        itm::solver_equalities_01coeff();
        operator_delete__(__s);
        (this->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        prVar6 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar6 != (rc_data *)0x0) {
          operator_delete__(prVar6);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        pdVar5 = (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        __stream = (FILE *)(this->super_debug_logger<true>).ofs;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        _Unwind_Resume(extraout_RAX);
      }
      __s[uVar10] = pmVar1[uVar10].min;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_01coeff(random_engine& rng_,
                              int m_,
                              int n_,
                              const cost_type& c_,
                              const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            bx_ensures(csts[i].min == csts[i].max);

            b[i] = csts[i].min;
        }
    }